

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O0

int bsumMain(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  bool_t bVar4;
  u32 uVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  long in_RSI;
  int in_EDI;
  bool bVar9;
  char *alg_name_1;
  char *alg_name;
  bool_t check;
  size_t hid;
  err_t code;
  char **in_stack_00000080;
  int in_stack_0000008c;
  size_t in_stack_00000090;
  char *in_stack_00000420;
  size_t in_stack_00000428;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_20;
  err_t local_14;
  long *local_10;
  int local_8;
  
  local_14 = 0;
  local_20 = 0xffffffffffffffff;
  bVar2 = false;
  if (in_EDI < 2) {
    iVar3 = bsumUsage();
    return iVar3;
  }
  local_10 = (long *)(in_RSI + 8);
  local_8 = in_EDI + -1;
  do {
    bVar9 = false;
    if (local_8 != 0) {
      bVar4 = strStartsWith((char *)*local_10,"-");
      bVar9 = bVar4 != 0;
    }
    if (!bVar9) goto LAB_00103508;
    bVar4 = strStartsWith((char *)*local_10,"-belt-hash");
    if (bVar4 == 0) {
      bVar4 = strStartsWith((char *)*local_10,"-bash-prg-hash");
      if (bVar4 == 0) {
        bVar4 = strStartsWith((char *)*local_10,"-bash");
        if (bVar4 != 0) {
          lVar1 = *local_10;
          sVar6 = strLen((char *)0x1033cc);
          if (((local_20 == 0xffffffffffffffff) &&
              (bVar4 = decIsValid(in_stack_ffffffffffffff98), bVar4 != 0)) &&
             ((sVar7 = strLen((char *)0x1033fd), 1 < sVar7 &&
              ((sVar7 = strLen((char *)0x103414), sVar7 < 5 &&
               (sVar7 = decCLZ((char *)(lVar1 + sVar6)), sVar7 == 0)))))) {
            uVar5 = decToU32((char *)(lVar1 + sVar6));
            local_20 = (ulong)uVar5;
            bVar4 = bsumHidIsValid(local_20);
            if (bVar4 != 0) goto LAB_00103503;
          }
          local_14 = 0x25b;
          goto LAB_00103508;
        }
        iVar3 = strCmp((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
        if (iVar3 != 0) {
          iVar3 = strCmp((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
          if (iVar3 == 0) {
            local_8 = local_8 + -1;
          }
          else {
            local_14 = 0x25b;
          }
          goto LAB_00103508;
        }
        if (bVar2) {
          local_14 = 0x25b;
          goto LAB_00103508;
        }
        bVar2 = true;
      }
      else {
        lVar1 = *local_10;
        sVar6 = strLen((char *)0x103307);
        if ((((local_20 != 0xffffffffffffffff) ||
             (bVar4 = decIsValid(in_stack_ffffffffffffff98), bVar4 == 0)) ||
            (sVar7 = strLen((char *)0x103338), sVar7 != 4)) ||
           (sVar7 = decCLZ((char *)(lVar1 + sVar6)), sVar7 != 0)) {
LAB_0010336b:
          local_14 = 0x25b;
LAB_00103508:
          __stream = _stderr;
          if ((local_14 == 0) && ((local_8 < 1 || ((bVar2 && (local_8 != 1)))))) {
            local_14 = 0x25b;
          }
          if (local_14 != 0) {
            pcVar8 = errMsg(local_14);
            fprintf(__stream,"bee2cmd/%s: %s\n","bsum",pcVar8);
            return -1;
          }
          if (bVar2) {
            iVar3 = bsumCheck(in_stack_00000428,in_stack_00000420);
            return iVar3;
          }
          iVar3 = bsumPrint(in_stack_00000090,in_stack_0000008c,in_stack_00000080);
          return iVar3;
        }
        uVar5 = decToU32((char *)(lVar1 + sVar6));
        local_20 = (ulong)uVar5;
        bVar4 = bsumHidIsValid(local_20);
        if (bVar4 == 0) goto LAB_0010336b;
      }
    }
    else {
      if (local_20 != 0xffffffffffffffff) {
        local_14 = 0x25b;
        goto LAB_00103508;
      }
      local_20 = 0;
    }
LAB_00103503:
    local_8 = local_8 + -1;
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int bsumMain(int argc, char* argv[])
{
	err_t code = ERR_OK;
	size_t hid = SIZE_MAX;
	bool_t check = FALSE;
#ifdef OS_WIN
	setlocale(LC_ALL, "russian_belarus.1251");
#endif
	// справка
	if (argc < 2)
		return bsumUsage();
	// разбор опций
	++argv, --argc;
	while (argc && strStartsWith(argv[0], "-"))
	{
		// belt-hash
		if (strStartsWith(argv[0], "-belt-hash"))
		{
			if (hid != SIZE_MAX)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			hid = 0;
			--argc, ++argv;
		}
		// bash-prg-hash
		else if (strStartsWith(argv[0], "-bash-prg-hash"))
		{
			char* alg_name = argv[0] + strLen("-bash-prg-hash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				strLen(alg_name) != 4 || decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// bash
		else if (strStartsWith(argv[0], "-bash"))
		{
			char* alg_name = argv[0] + strLen("-bash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				2 > strLen(alg_name) || strLen(alg_name) > 4 ||
				decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// check
		else if (strEq(argv[0], "-c"))
		{
			if (check)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			check = TRUE;
			--argc, ++argv;
		}
		// --
		else if (strEq(argv[0], "--"))
		{
			--argc, ++argv;
			break;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// дополнительные проверки и обработка ошибок
	if (code == ERR_OK && (argc < 1 || check && argc != 1))
		code = ERR_CMD_PARAMS;
	if (code != ERR_OK)
	{
		fprintf(stderr, "bee2cmd/%s: %s\n", _name, errMsg(code));
		return -1;
	}
	// belt-hash по умолчанию
	if (hid == SIZE_MAX)
		hid = 0;
	// вычисление/проверка хэш-значениий
	ASSERT(bsumHidIsValid(hid));
	return check ? bsumCheck(hid, argv[0]) : bsumPrint(hid, argc, argv);
}